

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index.h
# Opt level: O1

bool S2ShapeIndex::IteratorBase::LocateImpl<MutableS2ShapeIndex::Iterator>
               (S2Point *target_point,Iterator *it)

{
  ulong uVar1;
  __pointer_type pSVar2;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  *pbVar3;
  node_type *pnVar4;
  long lVar5;
  int iVar6;
  bool bVar7;
  bool bVar8;
  const_iterator cVar9;
  S2CellId target;
  S2CellId local_28;
  S2CellId local_20;
  
  S2CellId::S2CellId(&local_28,target_point);
  local_20.id_ = local_28.id_;
  cVar9 = gtl::internal_btree::
          btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
          ::lower_bound<S2CellId>
                    ((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                      *)&it->index_->cell_map_,&local_20);
  pbVar3 = cVar9.node;
  (it->iter_).node = pbVar3;
  iVar6 = cVar9.position;
  (it->iter_).position = iVar6;
  if ((pbVar3 == (it->end_).node) && (iVar6 == (it->end_).position)) {
    (it->super_IteratorBase).id_.id_ = 0xffffffffffffffff;
    (it->super_IteratorBase).cell_._M_b._M_p = (__pointer_type)0x0;
  }
  else {
    if (((undefined1  [16])cVar9 & (undefined1  [16])0x7) != (undefined1  [16])0x0)
    goto LAB_0019648e;
    pSVar2 = *(__pointer_type *)(pbVar3 + (long)iVar6 * 0x10 + 0x18);
    (it->super_IteratorBase).id_.id_ = *(uint64 *)(pbVar3 + (long)iVar6 * 0x10 + 0x10);
    (it->super_IteratorBase).cell_._M_b._M_p = pSVar2;
  }
  uVar1 = (it->super_IteratorBase).id_.id_;
  if ((uVar1 == 0xffffffffffffffff) || (bVar7 = true, local_28.id_ < uVar1 - (~uVar1 & uVar1 - 1)))
  {
    pnVar4 = gtl::internal_btree::
             btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
             ::leftmost((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                         *)&it->index_->cell_map_);
    bVar7 = (it->iter_).node != pnVar4;
    bVar8 = (it->iter_).position != 0;
    if (bVar8 || bVar7) {
      gtl::internal_btree::
      btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>,_const_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_&,_const_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_*>
      ::decrement(&it->iter_);
      pbVar3 = (it->iter_).node;
      iVar6 = (it->iter_).position;
      if ((pbVar3 == (it->end_).node) && (iVar6 == (it->end_).position)) {
        (it->super_IteratorBase).id_.id_ = 0xffffffffffffffff;
        (it->super_IteratorBase).cell_._M_b._M_p = (__pointer_type)0x0;
      }
      else {
        if (((ulong)pbVar3 & 7) != 0) {
LAB_0019648e:
          __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                        ,0x1e1,
                        "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2ShapeIndexCell *>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2ShapeIndexCell *>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
                       );
        }
        lVar5 = (long)iVar6 * 0x10;
        pSVar2 = *(__pointer_type *)&pbVar3[lVar5 + 0x18].field_0x0;
        (it->super_IteratorBase).id_.id_ = *(uint64 *)(pbVar3 + lVar5 + 0x10);
        (it->super_IteratorBase).cell_._M_b._M_p = pSVar2;
      }
      if ((bVar8 || bVar7) &&
         (uVar1 = (it->super_IteratorBase).id_.id_, local_28.id_ <= (uVar1 - 1 | uVar1))) {
        return true;
      }
    }
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

inline bool S2ShapeIndex::IteratorBase::LocateImpl(
    const S2Point& target_point, Iter* it) {
  // Let I = cell_map_->lower_bound(T), where T is the leaf cell containing
  // "target_point".  Then if T is contained by an index cell, then the
  // containing cell is either I or I'.  We test for containment by comparing
  // the ranges of leaf cells spanned by T, I, and I'.

  S2CellId target(target_point);
  it->Seek(target);
  if (!it->done() && it->id().range_min() <= target) return true;
  if (it->Prev() && it->id().range_max() >= target) return true;
  return false;
}